

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_text_string
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,string_type *str,
          error_code *ec)

{
  cbor_major_type cVar1;
  uint8_t uVar2;
  bool bVar3;
  char_result<unsigned_char> cVar4;
  undefined8 uVar5;
  vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>
  *this_00;
  reference this_01;
  size_type index;
  vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>
  *pvVar6;
  mapped_string *this_02;
  string_type *in_RDI;
  anon_class_8_1_ba1d7991 func;
  uint8_t info;
  cbor_major_type major_type;
  char_result<unsigned_char> c;
  string *in_stack_ffffffffffffff28;
  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
  *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  cbor_errc __e;
  mapped_string *__args;
  error_code *in_stack_ffffffffffffff40;
  error_code *in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff50;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  uint8_t local_1a;
  
  __e = (cbor_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  cVar4 = bytes_source::peek((bytes_source *)&in_RDI[1].field_2);
  if (((ushort)cVar4 & 0x100) == 0) {
    local_1a = cVar4.value;
    cVar1 = get_major_type(local_1a);
    uVar2 = get_additional_information_value(local_1a);
    if (cVar1 != text_string) {
      uVar5 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (allocator<char> *)in_stack_ffffffffffffff60);
      assertion_error::assertion_error
                ((assertion_error *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar5,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
    iterate_string_chunks<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_text_string(std::__cxx11::string&,std::error_code&)::_lambda(jsoncons::bytes_source&,unsigned_long,std::error_code&)_1_>
              (in_stack_ffffffffffffff60,(anon_class_8_1_ba1d7991 *)in_RDI,
               (cbor_major_type)((ulong)in_stack_ffffffffffffff50 >> 0x38),in_stack_ffffffffffffff48
              );
    bVar3 = std::
            vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
            ::empty((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
                     *)in_stack_ffffffffffffff40);
    if ((!bVar3) && (uVar2 != '\x1f')) {
      this_00 = (vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>
                 *)std::__cxx11::string::length();
      this_01 = std::
                vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
                ::back(in_stack_ffffffffffffff30);
      index = std::
              vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>
              ::size(this_01);
      pvVar6 = (vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>
                *)detail::min_length_for_stringref(index);
      if (pvVar6 <= this_00) {
        this_02 = (mapped_string *)
                  std::
                  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
                  ::back(in_stack_ffffffffffffff30);
        __args = (mapped_string *)&stack0xffffffffffffff60;
        mapped_string::mapped_string
                  ((mapped_string *)in_stack_ffffffffffffff60,in_RDI,in_stack_ffffffffffffff50);
        std::
        vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::mapped_string>>
        ::
        emplace_back<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::mapped_string>
                  (this_00,__args);
        mapped_string::~mapped_string(this_02);
      }
    }
  }
  else {
    std::error_code::operator=(in_stack_ffffffffffffff40,__e);
    *(undefined1 *)&in_RDI->_M_string_length = 0;
  }
  return;
}

Assistant:

void read_text_string(string_type& str, std::error_code& ec)
    {
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::text_string);
        auto func = [&str](Source& source, std::size_t length, std::error_code& ec) -> bool
        {
            if (source_reader<Source>::read(source, str, length) != length)
            {
                ec = cbor_errc::unexpected_eof;
                return false;
            }
            return true;
        };
        iterate_string_chunks(func, major_type, ec);

        if (!stringref_map_stack_.empty() && 
            info != jsoncons::cbor::detail::additional_info::indefinite_length &&
            str.length() >= jsoncons::cbor::detail::min_length_for_stringref(stringref_map_stack_.back().size()))
        {
            stringref_map_stack_.back().emplace_back(mapped_string(str,alloc_));
        }

    }